

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

int rw::strncmp_ci(char *s1,char *s2,int n)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    if (n == (int)lVar3) {
      return 0;
    }
    uVar1 = tolower((int)s1[lVar3]);
    iVar2 = tolower((int)s2[lVar3]);
    iVar2 = (int)(char)uVar1 - (int)(char)iVar2;
    if (iVar2 != 0) break;
    if ((uVar1 & 0xff) == 0) {
      return 0;
    }
    lVar3 = lVar3 + 1;
  }
  return iVar2;
}

Assistant:

int
strncmp_ci(const char *s1, const char *s2, int n)
{
	char c1, c2;
	while(n--){
		c1 = tolower(*s1);
		c2 = tolower(*s2);
		if(c1 != c2)
			return c1 - c2;
		if(c1 == '\0')
			return 0;
		s1++;
		s2++;
	}
	return 0;
}